

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O2

void __thiscall
glcts::FramebufferNoAttachmentsBaseCase::expect_fbo_status
          (FramebufferNoAttachmentsBaseCase *this,GLenum target,GLenum expected_status,
          char *fail_message)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  ostream *poVar5;
  TestError *this_00;
  ostringstream msgStr;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  if (dVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msgStr);
    poVar5 = std::operator<<(&msgStr.super_basic_ostream<char,_std::char_traits<char>_>,
                             "Error before glCheckFramebufferStatus() for \'");
    poVar5 = std::operator<<(poVar5,fail_message);
    std::operator<<(poVar5,"\'\n");
    glu::checkError(dVar2,"Error before glCheckFramebufferStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                    ,0x7b);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msgStr);
  }
  GVar3 = (**(code **)(lVar4 + 0x170))(target);
  if (GVar3 == expected_status) {
    dVar2 = (**(code **)(lVar4 + 0x800))();
    if (dVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msgStr);
      poVar5 = std::operator<<(&msgStr.super_basic_ostream<char,_std::char_traits<char>_>,
                               "Error after glCheckFramebufferStatus() for \'");
      poVar5 = std::operator<<(poVar5,fail_message);
      std::operator<<(poVar5,"\'\n");
      glu::checkError(dVar2,"Error after glCheckFramebufferStatus()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                      ,0x86);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msgStr);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,fail_message,"gl.checkFramebufferStatus(target) == expected_status",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
             ,0x7e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FramebufferNoAttachmentsBaseCase::expect_fbo_status(GLenum target, GLenum expected_status,
														 const char* fail_message)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLenum				  error;

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error before glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error before glCheckFramebufferStatus()");
	}

	TCU_CHECK_MSG(gl.checkFramebufferStatus(target) == expected_status, fail_message);

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error after glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error after glCheckFramebufferStatus()");
	}
}